

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  PlatformInterface *pPVar4;
  char *pcVar5;
  undefined1 value [4];
  void *pvVar6;
  Context *this;
  ulong uVar7;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  ulong uVar10;
  long *plVar11;
  void *pvVar12;
  Parameters *extraout_RDX;
  char **value_00;
  int iVar13;
  qpTestLog *pqVar14;
  ProgramBinary *pPVar15;
  VkResult *in_R9;
  ulong uVar16;
  bool bVar17;
  VkResult result;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> handles;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  Resources res;
  Environment objEnv;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  undefined1 local_2ec [4];
  void *local_2e8;
  void *pvStack_2e0;
  void *local_2d8;
  Context *local_2c8;
  char *local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  qpTestLog *local_288 [13];
  ios_base local_220 [264];
  Environment local_118;
  DeterministicFailAllocator local_e0;
  AllocationCallbackRecorder local_90;
  
  local_2e8 = (void *)0x0;
  pvStack_2e0 = (void *)0x0;
  local_2d8 = (void *)0x0;
  local_2e8 = operator_new(0x20);
  pvStack_2e0 = (void *)((long)local_2e8 + 0x20);
  local_2ec = (undefined1  [4])0x1;
  psVar1 = &__return_storage_ptr__->m_description;
  paVar2 = &(__return_storage_ptr__->m_description).field_2;
  uVar16 = 0;
  local_2d8 = pvStack_2e0;
  local_2c8 = context;
  do {
    this = local_2c8;
    pvVar6 = local_2e8;
    if (local_2e8 < pvStack_2e0) {
      pvVar12 = (void *)((long)local_2e8 + 8U);
      if ((void *)((long)local_2e8 + 8U) < pvStack_2e0) {
        pvVar12 = pvStack_2e0;
      }
      memset(local_2e8,0xde,(~(ulong)local_2e8 + (long)pvVar12 & 0xfffffffffffffff8) + 8);
    }
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_e0,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_90,&local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    pPVar4 = this->m_platformInterface;
    pDVar8 = Context::getDeviceInterface(this);
    pVVar9 = Context::getDevice(this);
    local_118.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this);
    local_118.programBinaries = this->m_progCollection;
    local_118.allocationCallbacks =
         &local_90.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_118.maxResourceConsumers = 4;
    local_298._0_8_ = this->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_298 + 8);
    local_118.vkp = pPVar4;
    local_118.vkd = pDVar8;
    local_118.device = pVVar9;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," allocation",0xb);
    pcVar5 = ",\n\t\t";
    if (uVar16 != 1) {
      pcVar5 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,pcVar5 + 4,(ulong)(uVar16 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_220);
    GraphicsPipeline::Resources::Resources((Resources *)local_298,&local_118,extraout_RDX);
    ::vk::DeterministicFailAllocator::reset(&local_e0,MODE_COUNT_AND_FAIL,(deUint32)uVar16);
    GraphicsPipeline::createMultiple
              ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                *)local_2b8,&local_118,(Resources *)local_298,(Parameters *)&local_2e8,
               (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                *)local_2ec,in_R9);
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
               *)local_2b8);
    GraphicsPipeline::Resources::~Resources((Resources *)local_298);
    value = local_2ec;
    if (local_2ec == (undefined1  [4])0x0) {
      local_298._0_8_ = this->m_testCtx->m_log;
      poVar3 = (ostringstream *)(local_298 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_220);
      iVar13 = 2;
    }
    else {
      iVar13 = 5;
      bVar17 = 3 < uVar16;
      if (!bVar17) {
        uVar7 = uVar16;
        if (*(long *)((long)pvVar6 + uVar16 * 8) == 0) {
          do {
            uVar10 = uVar7;
            bVar17 = 2 < uVar10;
            if (uVar10 == 3) goto LAB_0040529a;
            uVar7 = uVar10 + 1;
          } while (*(long *)((long)pvVar6 + uVar10 * 8 + 8) == 0);
          bVar17 = 2 < uVar10;
        }
        local_298._0_8_ = local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"Some object handles weren\'t set to NULL","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar1,local_298._0_8_,
                   (long)(qpTestLog **)local_298._0_8_ + local_298._8_8_);
        if ((ProgramBinary *)local_298._0_8_ != (ProgramBinary *)local_288) {
          operator_delete((void *)local_298._0_8_,(ulong)((long)&local_288[0]->flags + 1));
        }
        iVar13 = 1;
      }
LAB_0040529a:
      if (bVar17) {
        if (value == (undefined1  [4])0xffffffff) {
          bVar17 = ::vk::validateAndLog(local_2c8->m_testCtx->m_log,&local_90,0);
          iVar13 = 0;
          if (bVar17) goto LAB_0040549e;
          local_298._0_8_ = local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Invalid allocation callback","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_298._0_8_,
                     (long)(qpTestLog **)local_298._0_8_ + local_298._8_8_);
          pqVar14 = local_288[0];
          pPVar15 = (ProgramBinary *)local_298._0_8_;
          if ((ProgramBinary *)local_298._0_8_ != (ProgramBinary *)local_288) goto LAB_00405491;
        }
        else {
          local_2c0 = ::vk::getResultName((VkResult)value);
          de::toString<char_const*>((string *)local_2b8,(de *)&local_2c0,value_00);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,0xacbb28);
          local_298._0_8_ = local_288;
          pPVar15 = (ProgramBinary *)(plVar11 + 2);
          if ((ProgramBinary *)*plVar11 == pPVar15) {
            local_288[0] = *(qpTestLog **)pPVar15;
            local_288[1]._0_4_ = *(undefined4 *)(plVar11 + 3);
            local_288[1]._4_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
          }
          else {
            local_288[0] = *(qpTestLog **)pPVar15;
            local_298._0_8_ = (ProgramBinary *)*plVar11;
          }
          local_298._8_8_ = plVar11[1];
          *plVar11 = (long)pPVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_298._0_8_,
                     (long)(qpTestLog **)local_298._0_8_ + local_298._8_8_);
          if ((ProgramBinary *)local_298._0_8_ != (ProgramBinary *)local_288) {
            operator_delete((void *)local_298._0_8_,(ulong)((long)&local_288[0]->flags + 1));
          }
          pqVar14 = (qpTestLog *)local_2b8._16_8_;
          pPVar15 = (ProgramBinary *)local_2b8._0_8_;
          if ((ProgramBinary *)local_2b8._0_8_ != (ProgramBinary *)(local_2b8 + 0x10)) {
LAB_00405491:
            operator_delete(pPVar15,(ulong)((long)&pqVar14->flags + 1));
          }
        }
        iVar13 = 1;
      }
    }
LAB_0040549e:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
    if (iVar13 != 0) {
      if (iVar13 == 2) {
        bVar17 = true;
      }
      else {
        bVar17 = iVar13 == 0;
      }
      goto LAB_004054f1;
    }
    uVar16 = uVar16 + 1;
    if (uVar16 == 5) {
      bVar17 = true;
      uVar16 = 1;
LAB_004054f1:
      if (local_2e8 != (void *)0x0) {
        operator_delete(local_2e8,(long)local_2d8 - (long)local_2e8);
      }
      if (bVar17) {
        local_298._0_8_ = (ProgramBinary *)local_288;
        if ((int)uVar16 == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Allocation callbacks not called","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_298._0_8_,
                     (long)(qpTestLog **)local_298._0_8_ + local_298._8_8_);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"Ok","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_298._0_8_,
                     (long)(qpTestLog **)local_298._0_8_ + local_298._8_8_);
        }
        if ((ProgramBinary *)local_298._0_8_ != (ProgramBinary *)local_288) {
          operator_delete((void *)local_298._0_8_,(ulong)((long)&local_288[0]->flags + 1));
        }
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}